

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

char * __thiscall
Json::DefaultValueAllocator::duplicateStringValue
          (DefaultValueAllocator *this,char *value,uint length)

{
  size_t sVar1;
  char *__dest;
  char *newString;
  uint length_local;
  char *value_local;
  DefaultValueAllocator *this_local;
  
  newString._4_4_ = length;
  if (length == 0xffffffff) {
    sVar1 = strlen(value);
    newString._4_4_ = (uint)sVar1;
  }
  __dest = (char *)malloc((ulong)(newString._4_4_ + 1));
  memcpy(__dest,value,(ulong)newString._4_4_);
  __dest[newString._4_4_] = '\0';
  return __dest;
}

Assistant:

virtual char* duplicateStringValue ( const char* value,
                                         unsigned int length = unknown )
    {
        //@todo invesgate this old optimization
        //if ( !value  ||  value[0] == 0 )
        //   return 0;

        if ( length == unknown )
            length = (unsigned int)strlen (value);

        char* newString = static_cast<char*> ( malloc ( length + 1 ) );
        memcpy ( newString, value, length );
        newString[length] = 0;
        return newString;
    }